

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg.h
# Opt level: O0

void __thiscall spdlog::details::log_msg::log_msg(log_msg *this)

{
  basic_string_view<char> *in_RDI;
  
  ::fmt::v7::basic_string_view<char>::basic_string_view(in_RDI);
  *(undefined4 *)&in_RDI[1].data_ = 6;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_RDI);
  in_RDI[2].data_ = (char *)0x0;
  in_RDI[2].size_ = 0;
  in_RDI[3].data_ = (char *)0x0;
  source_loc::source_loc((source_loc *)&in_RDI[3].size_);
  ::fmt::v7::basic_string_view<char>::basic_string_view(in_RDI + 5);
  return;
}

Assistant:

log_msg() = default;